

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O1

void __thiscall
de::SharedPtrState<vkt::Draw::Image,_de::DefaultDeleter<vkt::Draw::Image>_>::deletePtr
          (SharedPtrState<vkt::Draw::Image,_de::DefaultDeleter<vkt::Draw::Image>_> *this)

{
  Image *pIVar1;
  pointer puVar2;
  VkImage obj;
  Allocation *pAVar3;
  
  pIVar1 = this->m_ptr;
  if (pIVar1 != (Image *)0x0) {
    puVar2 = (pIVar1->m_pixelAccessData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)(pIVar1->m_pixelAccessData).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2
                     );
    }
    obj.m_internal =
         (pIVar1->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&(pIVar1->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                 obj);
    }
    (pIVar1->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    (pIVar1->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    (pIVar1->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
    (pIVar1->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    pAVar3 = (pIVar1->m_allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    if (pAVar3 != (Allocation *)0x0) {
      (*pAVar3->_vptr_Allocation[1])();
      (pIVar1->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr = (Allocation *)0x0;
    }
    operator_delete(pIVar1,0x70);
  }
  this->m_ptr = (Image *)0x0;
  return;
}

Assistant:

virtual void deletePtr (void) throw()
	{
		m_deleter(m_ptr);
		m_ptr = DE_NULL;
	}